

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O2

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleTransformNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  aiNode *paVar1;
  DataArrayList *pDVar2;
  DeadlyImportError *pDVar3;
  Value *this_00;
  long lVar4;
  float fVar5;
  allocator<char> local_69;
  undefined1 local_68 [4];
  float local_64 [3];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  
  if (this->m_currentNode == (aiNode *)0x0) {
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_68,"No parent node for name.",&local_69);
    DeadlyImportError::DeadlyImportError(pDVar3,(string *)local_68);
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  pDVar2 = ODDLParser::DDLNode::getDataArrayList(node);
  if (pDVar2 != (DataArrayList *)0x0) {
    if (pDVar2->m_numItems != 0x10) {
      pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_68,"Invalid number of data for transform matrix.",&local_69);
      DeadlyImportError::DeadlyImportError(pDVar3,(string *)local_68);
      __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    paVar1 = this->m_currentNode;
    if (paVar1 == (aiNode *)0x0) {
      __assert_fail("nullptr != node",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                    ,0x286,"void Assimp::OpenGEX::setMatrix(aiNode *, DataArrayList *)");
    }
    this_00 = pDVar2->m_dataList->m_next;
    local_68 = (undefined1  [4])ODDLParser::Value::getFloat(pDVar2->m_dataList);
    lVar4 = 1;
    for (; this_00 != (Value *)0x0; this_00 = this_00->m_next) {
      fVar5 = ODDLParser::Value::getFloat(this_00);
      local_64[lVar4 + -1] = fVar5;
      lVar4 = lVar4 + 1;
    }
    if (lVar4 != 0x10) {
      __assert_fail("i == 16",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                    ,0x293,"void Assimp::OpenGEX::setMatrix(aiNode *, DataArrayList *)");
    }
    (paVar1->mTransformation).a1 = (float)local_68;
    (paVar1->mTransformation).a2 = (float)local_58._M_allocated_capacity._0_4_;
    (paVar1->mTransformation).a3 = local_48;
    (paVar1->mTransformation).a4 = local_38;
    (paVar1->mTransformation).b1 = local_64[0];
    (paVar1->mTransformation).b2 = (float)local_58._M_allocated_capacity._4_4_;
    (paVar1->mTransformation).b3 = local_44;
    (paVar1->mTransformation).b4 = local_34;
    (paVar1->mTransformation).c1 = local_64[1];
    (paVar1->mTransformation).c2 = (float)local_58._8_4_;
    (paVar1->mTransformation).c3 = local_40;
    (paVar1->mTransformation).c4 = local_30;
    (paVar1->mTransformation).d1 = local_64[2];
    (paVar1->mTransformation).d2 = (float)local_58._12_4_;
    (paVar1->mTransformation).d3 = local_3c;
    (paVar1->mTransformation).d4 = local_2c;
  }
  return;
}

Assistant:

void OpenGEXImporter::handleTransformNode( ODDLParser::DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == m_currentNode ) {
        throw DeadlyImportError( "No parent node for name." );
        return;
    }

    DataArrayList *transformData( node->getDataArrayList() );
    if( nullptr != transformData ) {
        if( transformData->m_numItems != 16 ) {
            throw DeadlyImportError( "Invalid number of data for transform matrix." );
            return;
        }
        setMatrix( m_currentNode, transformData );
    }
}